

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O3

bool ON_CRT_LOCALE::Validate_sprintf_s(void)

{
  int iVar1;
  long lVar2;
  char buffer [64];
  char local_48 [72];
  
  local_48[0x30] = '\0';
  local_48[0x31] = '\0';
  local_48[0x32] = '\0';
  local_48[0x33] = '\0';
  local_48[0x34] = '\0';
  local_48[0x35] = '\0';
  local_48[0x36] = '\0';
  local_48[0x37] = '\0';
  local_48[0x38] = '\0';
  local_48[0x39] = '\0';
  local_48[0x3a] = '\0';
  local_48[0x3b] = '\0';
  local_48[0x3c] = '\0';
  local_48[0x3d] = '\0';
  local_48[0x3e] = '\0';
  local_48[0x3f] = '\0';
  local_48[0x20] = '\0';
  local_48[0x21] = '\0';
  local_48[0x22] = '\0';
  local_48[0x23] = '\0';
  local_48[0x24] = '\0';
  local_48[0x25] = '\0';
  local_48[0x26] = '\0';
  local_48[0x27] = '\0';
  local_48[0x28] = '\0';
  local_48[0x29] = '\0';
  local_48[0x2a] = '\0';
  local_48[0x2b] = '\0';
  local_48[0x2c] = '\0';
  local_48[0x2d] = '\0';
  local_48[0x2e] = '\0';
  local_48[0x2f] = '\0';
  local_48[0x10] = '\0';
  local_48[0x11] = '\0';
  local_48[0x12] = '\0';
  local_48[0x13] = '\0';
  local_48[0x14] = '\0';
  local_48[0x15] = '\0';
  local_48[0x16] = '\0';
  local_48[0x17] = '\0';
  local_48[0x18] = '\0';
  local_48[0x19] = '\0';
  local_48[0x1a] = '\0';
  local_48[0x1b] = '\0';
  local_48[0x1c] = '\0';
  local_48[0x1d] = '\0';
  local_48[0x1e] = '\0';
  local_48[0x1f] = '\0';
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = '\0';
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  iVar1 = snprintf(local_48,0x3f,m_validation_print_format,0x9c5fe480);
  if (iVar1 == 0x11 && m_validation_string != (char *)0x0) {
    lVar2 = 0;
    do {
      if (local_48[lVar2] != m_validation_string[lVar2]) {
        return false;
      }
      if (local_48[lVar2] == '\0') {
        return lVar2 == 0x11;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x12);
  }
  return false;
}

Assistant:

static bool Validate_sprintf_s()
  {
#if defined(ON_COMPILER_CLANG)  || defined(ON_COMPILER_GNU)
    // Test formatted printing
    char buffer[64] = { 0 };
    size_t buffer_capacity = (sizeof(buffer) / sizeof(buffer[0])) - 1;
    // Testing C-runtime - do not using ON_String::FormatIntoBuffer
    int printf_rc = snprintf(buffer, buffer_capacity, m_validation_print_format, m_validation_value);
    return ValidateString(buffer, sizeof(buffer), printf_rc);
#else
    // Test formatted printing
    char buffer[64] = { 0 };
    size_t buffer_capacity = (sizeof(buffer) / sizeof(buffer[0])) - 1;
    // Testing C-runtime - do not using ON_String::FormatIntoBuffer
    int printf_rc = sprintf_s(buffer, buffer_capacity, m_validation_print_format, m_validation_value);
    return ValidateString(buffer, sizeof(buffer), printf_rc);
#endif
  }